

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

char * __thiscall cmTarget::GetPrefixVariableInternal(cmTarget *this,bool implib)

{
  TargetType TVar1;
  bool bVar2;
  bool local_79;
  cmTarget *local_78;
  cmTarget *local_70;
  allocator local_41;
  string local_40;
  byte local_19;
  cmTarget *pcStack_18;
  bool implib_local;
  cmTarget *this_local;
  
  local_19 = implib;
  pcStack_18 = this;
  TVar1 = GetType(this);
  switch(TVar1) {
  case EXECUTABLE:
    bVar2 = false;
    if ((local_19 & 1) == 0) {
      bVar2 = (this->IsAndroid & 1U) != 0;
      local_79 = false;
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_40,"ANDROID_GUI",&local_41);
        local_79 = GetPropertyAsBool(this,&local_40);
      }
      local_78 = (cmTarget *)0x90a50f;
      if (local_79 != false) {
        local_78 = (cmTarget *)0x8c8f3f;
      }
    }
    else {
      local_78 = (cmTarget *)0x8c8f23;
    }
    this_local = local_78;
    if (bVar2) {
      std::__cxx11::string::~string((string *)&local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
    }
    break;
  case STATIC_LIBRARY:
    this_local = (cmTarget *)anon_var_dwarf_1ec749;
    break;
  case SHARED_LIBRARY:
    if ((local_19 & 1) == 0) {
      local_70 = (cmTarget *)0x8c8f3f;
    }
    else {
      local_70 = (cmTarget *)0x8c8f23;
    }
    this_local = local_70;
    break;
  case MODULE_LIBRARY:
    this_local = (cmTarget *)"CMAKE_SHARED_MODULE_PREFIX";
    if ((local_19 & 1) != 0) {
      this_local = (cmTarget *)"CMAKE_IMPORT_LIBRARY_PREFIX";
    }
    break;
  default:
    this_local = (cmTarget *)0x90a50f;
  }
  return (char *)this_local;
}

Assistant:

const char* cmTarget::GetPrefixVariableInternal(bool implib) const
{
  switch(this->GetType())
    {
    case cmTarget::STATIC_LIBRARY:
      return "CMAKE_STATIC_LIBRARY_PREFIX";
    case cmTarget::SHARED_LIBRARY:
      return (implib
              ? "CMAKE_IMPORT_LIBRARY_PREFIX"
              : "CMAKE_SHARED_LIBRARY_PREFIX");
    case cmTarget::MODULE_LIBRARY:
      return (implib
              ? "CMAKE_IMPORT_LIBRARY_PREFIX"
              : "CMAKE_SHARED_MODULE_PREFIX");
    case cmTarget::EXECUTABLE:
      return (implib
              ? "CMAKE_IMPORT_LIBRARY_PREFIX"
                // Android GUI application packages store the native
                // binary as a shared library.
              : (this->IsAndroid && this->GetPropertyAsBool("ANDROID_GUI")?
                 "CMAKE_SHARED_LIBRARY_PREFIX" : ""));
    default:
      break;
    }
  return "";
}